

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

void __thiscall
ki::dml::Field<unsigned_int>::from_xml(Field<unsigned_int> *this,xml_node<char> *node)

{
  int iVar1;
  ostream *poVar2;
  value_error *pvVar3;
  xml_attribute<char> *pxVar4;
  long lVar5;
  long *plVar6;
  char *pcVar7;
  char *pcVar8;
  string name;
  string value_2;
  string value;
  long *local_250;
  long local_248;
  long local_240 [2];
  long *local_230;
  long local_228;
  long local_220 [2];
  xml_node<char> *local_210;
  string local_208;
  string local_1e8;
  string local_1c8;
  long *local_1a8;
  long local_1a0;
  long local_198 [45];
  
  pcVar8 = (node->super_xml_base<char>).m_name;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  pcVar7 = (char *)(this->super_FieldBase).m_name._M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)&(this->super_FieldBase).m_name,0,pcVar7,(ulong)pcVar8);
  (this->super_FieldBase).m_transferable = true;
  pxVar4 = node->m_first_attribute;
  local_210 = node;
  if (pxVar4 != (xml_attribute<char> *)0x0) {
    do {
      pcVar8 = (pxVar4->super_xml_base<char>).m_name;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string((string *)&local_250,pcVar8,(allocator *)&local_1a8);
      iVar1 = std::__cxx11::string::compare((char *)&local_250);
      if (iVar1 == 0) {
        pcVar8 = (pxVar4->super_xml_base<char>).m_value;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string((string *)&local_230,pcVar8,(allocator *)&local_1a8);
        get_type_name(this);
        iVar1 = std::__cxx11::string::compare((char *)&local_230);
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"XML Field node has incorrect TYPE attribute value. ",
                     0x33);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(value=\"",8);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,(char *)local_230,local_228);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", expected=\"",0xd);
          pcVar8 = get_type_name(this);
          poVar2 = std::operator<<(poVar2,pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\". ",3);
          pvVar3 = (value_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          value_error::value_error(pvVar3,&local_1c8);
          __cxa_throw(pvVar3,&value_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar5 = local_220[0];
        plVar6 = local_230;
        if (local_230 != local_220) goto LAB_0012d2e2;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_250);
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"XML Field node has unknown attribute \"",0x26);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,(char *)local_250,local_248);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
          pvVar3 = (value_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          value_error::value_error(pvVar3,&local_1e8);
          __cxa_throw(pvVar3,&value_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar8 = (pxVar4->super_xml_base<char>).m_value;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string((string *)&local_1a8,pcVar8,(allocator *)&local_230);
        iVar1 = std::__cxx11::string::compare((char *)&local_1a8);
        (this->super_FieldBase).m_transferable = iVar1 != 0;
        lVar5 = local_198[0];
        plVar6 = local_1a8;
        if (local_1a8 != local_198) {
LAB_0012d2e2:
          operator_delete(plVar6,lVar5 + 1);
        }
      }
      if (local_250 != local_240) {
        operator_delete(local_250,local_240[0] + 1);
      }
    } while (((pxVar4->super_xml_base<char>).m_parent != (xml_node<char> *)0x0) &&
            (pxVar4 = pxVar4->m_next_attribute, pxVar4 != (xml_attribute<char> *)0x0));
  }
  pcVar8 = (local_210->super_xml_base<char>).m_value;
  pcVar7 = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar8 != (char *)0x0) {
    pcVar7 = pcVar8;
  }
  std::__cxx11::string::string((string *)&local_1a8,pcVar7,(allocator *)&local_250);
  if (local_1a0 != 0) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_1a8,(long)local_1a8 + local_1a0);
    set_value_from_string(this,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  return;
}

Assistant:

void from_xml(const rapidxml::xml_node<> *node) final
		{
			// Use the name of the node as the field name and,
			// default transferable to TRUE.
			m_name = node->name();
			m_transferable = true;

			for (auto *attr = node->first_attribute();
				attr; attr = attr->next_attribute())
			{
				const std::string name = attr->name();
				if (name == "TYPE")
				{
					const std::string value = attr->value();
					if (value != get_type_name())
					{
						std::ostringstream oss;
						oss << "XML Field node has incorrect TYPE attribute value. ";
						oss << "(value=\"" << value << "\", expected=\"" << get_type_name() << "\". ";
						throw value_error(oss.str());
					}
				}
				else if (name == "NOXFER")
				{
					const std::string value = attr->value();
					m_transferable = value != "TRUE";
				}
				else
				{
					std::ostringstream oss;
					oss << "XML Field node has unknown attribute \"" << name << "\".";
					throw value_error(oss.str());
				}
			}

			const std::string value = node->value();
			if (!value.empty())
				set_value_from_string(value);
		}